

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::~Recycler(Recycler *this)

{
  Type_conflict pSVar1;
  CriticalSection *this_00;
  code *pcVar2;
  bool bVar3;
  CollectionState CVar4;
  undefined4 *puVar5;
  ConfigFlagsTable *pCVar6;
  Type_conflict *ppSVar7;
  SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *this_01;
  long *plVar8;
  long extraout_RDX;
  code *local_628;
  char16_t *local_5f0;
  char16_t *local_5e0;
  AutoLeakReportSection local_5a0;
  AutoLeakReportSection __autoLeakReportSection1;
  AutoLeakReportSection __autoLeakReportSection0;
  Param param;
  Recycler *list;
  Recycler *this_local;
  FreeFuncType freeFunc;
  NodeBase *next;
  NodeBase *current;
  
  if ((this->isAborting & 1U) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1af,"(!this->isAborting)","!this->isAborting");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  CCLock::Enter(&recyclerListLock.super_CCLock);
  if (recyclerList == this) {
    recyclerList = this->next;
  }
  else if (recyclerList != (Recycler *)0x0) {
    for (param.stats._1328_8_ = recyclerList; *(Recycler **)(param.stats._1328_8_ + 0x166d8) != this
        ; param.stats._1328_8_ = *(undefined8 *)(param.stats._1328_8_ + 0x166d8)) {
    }
    *(Recycler **)(param.stats._1328_8_ + 0x166d8) = this->next;
  }
  CCLock::Leave(&recyclerListLock.super_CCLock);
  this->isShuttingDown = true;
  ResetThreadId(this);
  ClearObjectBeforeCollectCallbacks(this);
  pCVar6 = GetRecyclerFlagsTable(this);
  if ((pCVar6->DumpObjectGraphOnExit & 1U) != 0) {
    memset((Param *)&__autoLeakReportSection0,0,0x548);
    DumpObjectGraph(this,(Param *)&__autoLeakReportSection0);
  }
  pCVar6 = GetRecyclerFlagsTable(this);
  bVar3 = IsInDllCanUnloadNow(this);
  if (bVar3) {
    local_5e0 = L"DllCanUnloadNow";
  }
  else {
    bVar3 = IsInDetachProcess(this);
    local_5e0 = L"Destructor";
    if (bVar3) {
      local_5e0 = L"DetachProcess";
    }
  }
  AutoLeakReportSection::AutoLeakReportSection
            (&__autoLeakReportSection1,pCVar6,L"Recycler (%p): %s",this,local_5e0);
  ReportLeaks(this);
  bVar3 = IsInDllCanUnloadNow(this);
  if (bVar3) {
    local_5f0 = L"DllCanUnloadNow";
  }
  else {
    bVar3 = IsInDetachProcess(this);
    local_5f0 = L"Destructor";
    if (bVar3) {
      local_5f0 = L"DetachProcess";
    }
  }
  CheckLeaks(this,local_5f0);
  pCVar6 = GetRecyclerFlagsTable(this);
  AutoLeakReportSection::AutoLeakReportSection(&local_5a0,pCVar6,L"Skipped finalizers","");
  if (this->concurrentThread != (HANDLE)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1e7,"(concurrentThread == nullptr)","concurrentThread == nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (this->recyclerSweepManager != (RecyclerSweepManager *)0x0) {
    RecyclerSweepManager::ShutdownCleanup(this->recyclerSweepManager);
    this->recyclerSweepManager = (RecyclerSweepManager *)0x0;
  }
  if (this->mainThreadHandle != (HANDLE)0x0) {
    CloseHandle(this->mainThreadHandle);
  }
  HeapInfoManager::Close(&this->autoHeap);
  MarkContext::Release(&this->markContext);
  MarkContext::Release(&this->parallelMarkContext1);
  MarkContext::Release(&this->parallelMarkContext2);
  MarkContext::Release(&this->parallelMarkContext3);
  WeakReferenceHashTable<PrimePolicy>::Map<Memory::Recycler::~Recycler()::__0>
            (&this->weakReferenceMap);
  this_01 = &this->clientTrackedObjectList;
  ppSVar7 = SListNodeBase<Memory::ArenaAllocator>::Next
                      (&this_01->super_SListNodeBase<Memory::ArenaAllocator>);
  next = *ppSVar7;
  while (bVar3 = SListBase<void_*,_Memory::ArenaAllocator,_RealCount>::IsHead(this_01,next),
        ((bVar3 ^ 0xffU) & 1) != 0) {
    ppSVar7 = SListNodeBase<Memory::ArenaAllocator>::Next(next);
    pSVar1 = *ppSVar7;
    local_628 = (code *)TypeAllocatorFunc<Memory::ArenaAllocator,_void_*>::GetFreeFunc();
    plVar8 = (long *)((long)&(this->clientTrackedObjectAllocator).
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             .super_Allocator.outOfMemoryFunc + extraout_RDX);
    if (((ulong)local_628 & 1) != 0) {
      local_628 = *(code **)(local_628 + *plVar8 + -1);
    }
    (*local_628)(plVar8,next,0x10);
    next = pSVar1;
  }
  SListBase<void_*,_Memory::ArenaAllocator,_RealCount>::Reset(this_01);
  if (this->trackerDictionary != (TypeInfotoTrackerItemMap *)0x0) {
    JsUtil::
    BaseDictionary<std::type_info_const*,Memory::Recycler::TrackerItem*,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::Map<Memory::Recycler::~Map()::__1>
              ((BaseDictionary<std::type_info_const*,Memory::Recycler::TrackerItem*,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this->trackerDictionary);
    DeleteObject<Memory::NoCheckHeapAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::BaseDictionary<std::type_info_const*,Memory::Recycler::TrackerItem*,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>>
              ((AllocatorType *)&NoCheckHeapAllocator::Instance,this->trackerDictionary);
    this->trackerDictionary = (TypeInfotoTrackerItemMap *)0x0;
    this_00 = this->trackerCriticalSection;
    if (this_00 != (CriticalSection *)0x0) {
      CriticalSection::~CriticalSection(this_00);
      operator_delete(this_00);
    }
  }
  HeapInfoManager::ShutdownIdleDecommit(&this->autoHeap);
  CVar4 = ObservableValue::operator_cast_to_CollectionState
                    ((ObservableValue *)&this->collectionState);
  if ((CVar4 != CollectionStateExit) &&
     (CVar4 = ObservableValue::operator_cast_to_CollectionState
                        ((ObservableValue *)&this->collectionState),
     CVar4 != CollectionStateNotCollecting)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x22b,
                       "(this->collectionState == CollectionStateExit || this->collectionState == CollectionStateNotCollecting)"
                       ,
                       "this->collectionState == CollectionStateExit || this->collectionState == CollectionStateNotCollecting"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (((this->disableConcurrentThreadExitedCheck & 1U) == 0) &&
     ((this->concurrentThreadExited & 1U) != 1)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x22d,
                       "(this->disableConcurrentThreadExitedCheck || this->concurrentThreadExited == true)"
                       ,
                       "this->disableConcurrentThreadExitedCheck || this->concurrentThreadExited == true"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  AutoLeakReportSection::~AutoLeakReportSection(&local_5a0);
  AutoLeakReportSection::~AutoLeakReportSection(&__autoLeakReportSection1);
  JsUtil::
  BaseDictionary<void_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::AsymetricResizeLock>
  ::~BaseDictionary(&this->pendingWriteBarrierBlockMap);
  ArenaAllocator::~ArenaAllocator(&this->objectBeforeCollectCallbackArena);
  HeapInfoManager::~HeapInfoManager(&this->autoHeap);
  DListBase<Memory::ArenaAllocator,_RealCount>::~DListBase(&this->backgroundProfilerArena);
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::~PageAllocatorBase(&this->backgroundProfilerPageAllocator);
  ArenaAllocator::~ArenaAllocator(&this->clientTrackedObjectAllocator);
  SListBase<void_*,_Memory::ArenaAllocator,_RealCount>::~SListBase(&this->clientTrackedObjectList);
  RecyclerParallelThread::~RecyclerParallelThread(&this->parallelThread2);
  RecyclerParallelThread::~RecyclerParallelThread(&this->parallelThread1);
  PagePool::~PagePool(&this->parallelMarkPagePool3);
  PagePool::~PagePool(&this->parallelMarkPagePool2);
  PagePool::~PagePool(&this->parallelMarkPagePool1);
  PagePool::~PagePool(&this->markPagePool);
  MarkContext::~MarkContext(&this->parallelMarkContext3);
  MarkContext::~MarkContext(&this->parallelMarkContext2);
  MarkContext::~MarkContext(&this->parallelMarkContext1);
  MarkContext::~MarkContext(&this->markContext);
  DListBase<Memory::ArenaData_*,_RealCount>::~DListBase(&this->externalGuestArenaList);
  DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::~DListBase(&this->guestArenaList);
  SList<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>::~SList
            (&this->weakReferenceRegionList);
  WeakReferenceHashTable<PrimePolicy>::~WeakReferenceHashTable(&this->weakReferenceMap);
  SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
  ::~SimpleHashTable(&this->pinnedObjectMap);
  HeapBlockMap64::~HeapBlockMap64(&this->heapBlockMap);
  return;
}

Assistant:

Recycler::~Recycler()
{
#if ENABLE_CONCURRENT_GC
    Assert(!this->isAborting);
#endif
#if DBG && GLOBAL_ENABLE_WRITE_BARRIER
    recyclerListLock.Enter();
    if (recyclerList == this)
    {
        recyclerList = this->next;
    }
    else if(recyclerList)
    {
        Recycler* list = recyclerList;
        while (list->next != this)
        {
            list = list->next;
        }
        list->next = this->next;
    }
    recyclerListLock.Leave();
#endif

    // Stop any further collection
    this->isShuttingDown = true;

#if DBG
    this->ResetThreadId();
#endif

#ifdef ENABLE_JS_ETW
    FlushFreeRecord();
#endif

    ClearObjectBeforeCollectCallbacks();

#ifdef RECYCLER_DUMP_OBJECT_GRAPH
    if (GetRecyclerFlagsTable().DumpObjectGraphOnExit)
    {
        // Always skip stack here, as we may be running the dtor on another thread.
        RecyclerObjectGraphDumper::Param param = { 0 };
        param.skipStack = true;
        this->DumpObjectGraph(&param);
    }
#endif

    AUTO_LEAK_REPORT_SECTION(this->GetRecyclerFlagsTable(), _u("Recycler (%p): %s"), this, this->IsInDllCanUnloadNow()? _u("DllCanUnloadNow") :
        this->IsInDetachProcess()? _u("DetachProcess") : _u("Destructor"));
#ifdef LEAK_REPORT
    ReportLeaks();
#endif

#ifdef CHECK_MEMORY_LEAK
    CheckLeaks(this->IsInDllCanUnloadNow()? _u("DllCanUnloadNow") : this->IsInDetachProcess()? _u("DetachProcess") : _u("Destructor"));
#endif

    AUTO_LEAK_REPORT_SECTION_0(this->GetRecyclerFlagsTable(), _u("Skipped finalizers"));

#if ENABLE_CONCURRENT_GC
    Assert(concurrentThread == nullptr);

    // We only sometime clean up the state after abort concurrent to not collection
    // Still need to delete heap block that is held by the recyclerSweep
    if (recyclerSweepManager != nullptr)
    {
        recyclerSweepManager->ShutdownCleanup();
        recyclerSweepManager = nullptr;
    }

    if (mainThreadHandle != nullptr)
    {
        CloseHandle(mainThreadHandle);
    }
#endif

    autoHeap.Close();

    markContext.Release();
    parallelMarkContext1.Release();
    parallelMarkContext2.Release();
    parallelMarkContext3.Release();

    // Clean up the weak reference map so that
    // objects being finalized can safely refer to weak references
    // (this could otherwise become a problem for weak references held
    // to large objects since their block would be destroyed before
    // the finalizer was run)
    // When the recycler is shutting down, all objects are going to be reclaimed
    // so null out the weak references so that anyone relying on weak
    // references simply thinks the object has been reclaimed
    weakReferenceMap.Map([](RecyclerWeakReferenceBase * weakRef) -> bool
    {
        weakRef->strongRef = nullptr;

        // Put in a dummy heap block so that we can still do the isPendingConcurrentSweep check first.
        weakRef->strongRefHeapBlock = &CollectedRecyclerWeakRefHeapBlock::Instance;

        // Remove
        return false;
    });

#if ENABLE_PARTIAL_GC
    clientTrackedObjectList.Clear(&this->clientTrackedObjectAllocator);
#endif

#ifdef PROFILE_RECYCLER_ALLOC
    if (trackerDictionary != nullptr)
    {
        this->trackerDictionary->Map([](type_info const *, TrackerItem * item)
        {
            NoCheckHeapDelete(item);
        });
        NoCheckHeapDelete(this->trackerDictionary);
        this->trackerDictionary = nullptr;
        delete(trackerCriticalSection);
    }
#endif

#ifdef RECYCLER_MARK_TRACK
    NoCheckHeapDelete(this->markMap);
    this->markMap = nullptr;
#endif

#if DBG
    // Disable idle decommit asserts
    autoHeap.ShutdownIdleDecommit();
#endif
    Assert(this->collectionState == CollectionStateExit || this->collectionState == CollectionStateNotCollecting);
#if ENABLE_CONCURRENT_GC
    Assert(this->disableConcurrentThreadExitedCheck || this->concurrentThreadExited == true);
#endif
}